

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O0

bool __thiscall BooleanArray2D::at(BooleanArray2D *this,uint row,uint col)

{
  out_of_range *poVar1;
  uint uVar2;
  uchar byte;
  uint bit_index;
  uint byte_index;
  uint index;
  uint col_local;
  uint row_local;
  BooleanArray2D *this_local;
  
  if (this->rows <= row) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar1,"Row out of range.");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (this->cols <= col) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar1,"Column out of range.");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar2 = row * this->cols + col;
  return ((int)(uint)this->data[uVar2 >> 3] >> ((byte)uVar2 & 7) & 1U) == 1;
}

Assistant:

bool BooleanArray2D::at(unsigned int row, unsigned int col) const
{
    if(row >= rows) {
        throw std::out_of_range("Row out of range.");
    }
    if(col >= cols) {
        throw std::out_of_range("Column out of range.");
    }

    unsigned int index = row * cols + col;
    unsigned int byte_index = index / 8;
    unsigned int bit_index = index % 8;
    unsigned char byte = data[byte_index];
    //is bit with bit_index is set in byte:
    return (1 == ((byte >> bit_index) & 1U));
}